

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O2

void __thiscall
cmGeneratedFileStream::cmGeneratedFileStream
          (cmGeneratedFileStream *this,void **vtt,Encoding encoding)

{
  _func_int **pp_Var1;
  codecvt *this_00;
  locale lStack_48;
  locale local_40;
  locale local_38;
  
  cmGeneratedFileStreamBase::cmGeneratedFileStreamBase
            ((cmGeneratedFileStreamBase *)
             &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  std::ofstream::ofstream(this);
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       pp_Var1;
  *(void **)((long)&(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream + (long)pp_Var1[-3]) = vtt[5];
  if (encoding != None) {
    std::locale::locale(&lStack_48,
                        (locale *)
                        (&(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                          field_0xd0 +
                        (long)(this->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                              [-3]));
    this_00 = (codecvt *)operator_new(0x20);
    codecvt::codecvt(this_00,encoding);
    std::locale::locale<codecvt>(&local_40,&lStack_48,this_00);
    std::ios::imbue(&local_38);
    std::locale::~locale(&local_38);
    std::locale::~locale(&local_40);
    std::locale::~locale(&lStack_48);
  }
  return;
}

Assistant:

cmGeneratedFileStream::cmGeneratedFileStream(Encoding encoding)
{
#ifndef CMAKE_BOOTSTRAP
  if (encoding != codecvt::None) {
    this->imbue(std::locale(this->getloc(), new codecvt(encoding)));
  }
#else
  static_cast<void>(encoding);
#endif
}